

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O2

span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> __thiscall
slang::ast::cloneArguments
          (ast *this,Compilation *compilation,Scope *newParent,
          span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> source)

{
  FormalArgumentSymbol *this_00;
  FormalArgumentSymbol *pFVar1;
  Expression *pEVar2;
  undefined4 extraout_var;
  pointer ppFVar3;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_00;
  __extent_storage<18446744073709551615UL> extraout_RDX_01;
  long lVar4;
  span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> sVar5;
  FormalArgumentSymbol *copied;
  SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL> arguments;
  FormalArgumentSymbol *local_80;
  Scope *local_78;
  SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL> local_70;
  
  ppFVar3 = source._M_ptr;
  local_78 = newParent;
  SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL>::SmallVector
            (&local_70,ppFVar3,newParent,ppFVar3,source._M_extent._M_extent_value._M_extent_value);
  src = extraout_RDX;
  for (lVar4 = 0; (long)ppFVar3 << 3 != lVar4; lVar4 = lVar4 + 8) {
    this_00 = *(FormalArgumentSymbol **)((long)&local_78->compilation + lVar4);
    local_80 = BumpAllocator::
               emplace<slang::ast::FormalArgumentSymbol,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation_const&,slang::ast::ArgumentDirection_const&,slang::ast::VariableLifetime_const&>
                         ((BumpAllocator *)this,
                          &(this_00->super_VariableSymbol).super_ValueSymbol.super_Symbol.name,
                          &(this_00->super_VariableSymbol).super_ValueSymbol.super_Symbol.location,
                          &this_00->direction,&(this_00->super_VariableSymbol).lifetime);
    (local_80->super_VariableSymbol).flags.m_bits = (this_00->super_VariableSymbol).flags.m_bits;
    DeclaredType::setLink
              (&(local_80->super_VariableSymbol).super_ValueSymbol.declaredType,
               &(this_00->super_VariableSymbol).super_ValueSymbol.declaredType);
    pFVar1 = local_80;
    pEVar2 = FormalArgumentSymbol::getDefaultValue(this_00);
    pFVar1->defaultVal = pEVar2;
    pFVar1->defaultValSyntax = (ExpressionSyntax *)0x0;
    Scope::addMember((Scope *)compilation,(Symbol *)local_80);
    SmallVectorBase<slang::ast::FormalArgumentSymbol_const*>::
    emplace_back<slang::ast::FormalArgumentSymbol_const*const&>
              ((SmallVectorBase<slang::ast::FormalArgumentSymbol_const*> *)&local_70,&local_80);
    src = extraout_RDX_00;
  }
  sVar5._M_ptr._0_4_ =
       SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>::copy
                 (&local_70.super_SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>,
                  (EVP_PKEY_CTX *)this,src);
  sVar5._M_ptr._4_4_ = extraout_var;
  SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>::cleanup
            (&local_70.super_SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>,
             (EVP_PKEY_CTX *)this);
  sVar5._M_extent._M_extent_value = extraout_RDX_01._M_extent_value;
  return sVar5;
}

Assistant:

static std::span<const FormalArgumentSymbol* const> cloneArguments(
    Compilation& compilation, Scope& newParent,
    std::span<const FormalArgumentSymbol* const> source) {

    SmallVector<const FormalArgumentSymbol*> arguments(source.size(), UninitializedTag());
    for (auto arg : source) {
        auto copied = compilation.emplace<FormalArgumentSymbol>(arg->name, arg->location,
                                                                arg->direction, arg->lifetime);
        copied->flags = arg->flags;
        copied->getDeclaredType()->setLink(*arg->getDeclaredType());
        copied->setDefaultValue(arg->getDefaultValue());

        newParent.addMember(*copied);
        arguments.push_back(copied);
    }

    return arguments.copy(compilation);
}